

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_unchange_all.c
# Opt level: O2

int zip_unchange_all(zip_t *za)

{
  _Bool _Var1;
  uint uVar2;
  ulong idx;
  uint uVar3;
  
  _Var1 = _zip_hash_revert(za->names,&za->error);
  if (_Var1) {
    uVar3 = 0;
    for (idx = 0; idx < za->nentry; idx = idx + 1) {
      uVar2 = _zip_unchange(za,idx,1);
      uVar3 = uVar3 | uVar2;
    }
    uVar2 = zip_unchange_archive(za);
    uVar2 = uVar2 | uVar3;
  }
  else {
    uVar2 = 0xffffffff;
  }
  return uVar2;
}

Assistant:

ZIP_EXTERN int
zip_unchange_all(zip_t *za) {
    int ret;
    zip_uint64_t i;

    if (!_zip_hash_revert(za->names, &za->error)) {
	return -1;
    }

    ret = 0;
    for (i = 0; i < za->nentry; i++)
	ret |= _zip_unchange(za, i, 1);

    ret |= zip_unchange_archive(za);

    return ret;
}